

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Gridded_Data_PDU::Gridded_Data_PDU(Gridded_Data_PDU *this)

{
  Gridded_Data_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Gridded_Data_PDU_0032e2b0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID);
  this->m_ui16FieldNum = 0;
  this->m_ui16PDUNum = 0;
  this->m_ui16PDUTotal = 0;
  this->m_ui16CordSys = 0;
  this->m_ui8NumAxis = '\0';
  this->m_ui8ConstGrid = '\0';
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  this->m_ui64SampleTime = 0;
  this->m_ui32TotalValues = 0;
  this->m_ui8VecDim = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding1 = '\0';
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::vector(&this->m_vpGridAxisDesc);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::vector(&this->m_vGridData);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8PDUType = '*';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x40;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Gridded_Data_PDU::Gridded_Data_PDU() :
    m_ui16FieldNum( 0 ),
    m_ui16PDUNum( 0 ),
    m_ui16PDUTotal( 0 ),
    m_ui16CordSys( 0 ),
    m_ui8NumAxis( 0 ),
    m_ui8ConstGrid( 0 ),
    m_ui64SampleTime( 0 ),
    m_ui32TotalValues( 0 ),
    m_ui8VecDim( 0 ),
    m_ui16Padding1( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8PDUType = GriddedData_PDU_Type;
    m_ui16PDULength = GRIDDED_DATA_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}